

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Value::operator[](Value *this,ArrayIndex index)

{
  bool bVar1;
  ValueType VVar2;
  Value *__y;
  reference ppVar3;
  ArrayIndex in_ESI;
  Value *in_RDI;
  value_type defaultValue;
  iterator it;
  CZString key;
  OStringStream oss;
  pair<const_Json::Value::CZString,_Json::Value> *in_stack_fffffffffffffd58;
  pair<const_Json::Value::CZString,_Json::Value> *in_stack_fffffffffffffd60;
  const_iterator in_stack_fffffffffffffd68;
  String *in_stack_fffffffffffffd70;
  undefined6 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7e;
  undefined1 uVar4;
  pair<const_Json::Value::CZString,_Json::Value> *this_00;
  undefined8 in_stack_fffffffffffffd88;
  ValueType type;
  _Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>
  in_stack_fffffffffffffda8;
  _Self local_208;
  _Self local_200;
  pair<const_Json::Value::CZString,_Json::Value> local_1f8;
  ostringstream local_190 [380];
  ArrayIndex local_14;
  Value *local_8;
  
  type = (ValueType)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  local_14 = in_ESI;
  VVar2 = Value::type(in_RDI);
  if ((VVar2 != nullValue) && (VVar2 = Value::type(in_RDI), VVar2 != arrayValue)) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::operator<<((ostream *)local_190,
                    "in Json::Value::operator[](ArrayIndex): requires arrayValue");
    std::__cxx11::ostringstream::str();
    throwLogicError(in_stack_fffffffffffffd70);
  }
  VVar2 = Value::type(in_RDI);
  if (VVar2 == nullValue) {
    Value(&local_1f8.second,type);
    operator=((Value *)in_stack_fffffffffffffd60,(Value *)in_stack_fffffffffffffd58);
    ~Value((Value *)in_stack_fffffffffffffd60);
  }
  this_00 = &local_1f8;
  CZString::CZString(&this_00->first,local_14);
  local_200._M_node =
       (_Base_ptr)
       std::
       map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
       ::lower_bound((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                      *)in_stack_fffffffffffffd58,(key_type *)0x1feb0f);
  local_208._M_node =
       (_Base_ptr)
       std::
       map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
       ::end((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
              *)in_stack_fffffffffffffd58);
  bVar1 = std::operator!=(&local_200,&local_208);
  uVar4 = false;
  if (bVar1) {
    std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
              ((_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *)0x1feb69);
    in_stack_fffffffffffffd7e =
         CZString::operator==((CZString *)in_stack_fffffffffffffda8._M_node,(CZString *)in_RDI);
    uVar4 = in_stack_fffffffffffffd7e;
  }
  if ((bool)uVar4 == false) {
    __y = nullSingleton();
    std::pair<const_Json::Value::CZString,_Json::Value>::pair<Json::Value::CZString_&,_true>
              (this_00,(CZString *)
                       CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,in_stack_fffffffffffffd78))
               ,__y);
    in_stack_fffffffffffffd60 =
         (pair<const_Json::Value::CZString,_Json::Value> *)(in_RDI->value_).map_;
    std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
    _Rb_tree_const_iterator
              ((_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *)
               &stack0xfffffffffffffda8,&local_200);
    local_200._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
         ::insert<std::pair<Json::Value::CZString_const,Json::Value>&>
                   ((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                     *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd68,in_stack_fffffffffffffd58
                   );
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *)
                        0x1fec58);
    local_8 = &ppVar3->second;
    std::pair<const_Json::Value::CZString,_Json::Value>::~pair(in_stack_fffffffffffffd60);
  }
  else {
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *)
                        0x1feba0);
    local_8 = &ppVar3->second;
  }
  CZString::~CZString(&in_stack_fffffffffffffd60->first);
  return local_8;
}

Assistant:

Value& Value::operator[](ArrayIndex index) {
  JSON_ASSERT_MESSAGE(
      type() == nullValue || type() == arrayValue,
      "in Json::Value::operator[](ArrayIndex): requires arrayValue");
  if (type() == nullValue)
    *this = Value(arrayValue);
  CZString key(index);
  auto it = value_.map_->lower_bound(key);
  if (it != value_.map_->end() && (*it).first == key)
    return (*it).second;

  ObjectValues::value_type defaultValue(key, nullSingleton());
  it = value_.map_->insert(it, defaultValue);
  return (*it).second;
}